

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,ostream *out)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TPZGeoNode *this_00;
  ostream *in_RSI;
  TPZGeoEl *in_RDI;
  int i;
  ostream *in_stack_ffffffffffffff88;
  TPZArc3D *in_stack_ffffffffffffff90;
  int local_40;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<(in_RSI,"Geo Element - fId ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->fId);
  poVar3 = std::operator<<(poVar3,"\t Type ");
  pzgeom::TPZArc3D::TypeName_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\t");
  std::__cxx11::string::~string(local_30);
  pzgeom::TPZArc3D::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  poVar3 = (ostream *)std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"\t");
  local_40 = 0;
  while( true ) {
    iVar2 = local_40;
    iVar1 = (**(code **)(*(long *)in_RDI + 0x90))();
    if (iVar1 <= iVar2) break;
    poVar3 = local_10;
    this_00 = TPZGeoEl::NodePtr(in_RDI,iVar2);
    iVar2 = TPZGeoNode::Id(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," ");
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}